

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_node pugi::impl::anon_unknown_0::xpath_first(xpath_node *begin,xpath_node *end,type_t type)

{
  xpath_node xVar1;
  xpath_node *pxVar2;
  document_order_comparator local_2d;
  type_t local_2c;
  xpath_node *pxStack_28;
  type_t type_local;
  xpath_node *end_local;
  xpath_node *begin_local;
  xml_attribute local_10;
  
  local_2c = type;
  pxStack_28 = end;
  end_local = begin;
  if (begin == end) {
    xpath_node::xpath_node((xpath_node *)&begin_local);
  }
  else if (type == type_unsorted) {
    pxVar2 = (anonymous_namespace)::
             min_element<pugi::xpath_node_const*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                       (begin,end,&local_2d);
    begin_local = (xpath_node *)(pxVar2->_node)._root;
    local_10._attr = (pxVar2->_attribute)._attr;
  }
  else if (type == type_sorted) {
    begin_local = (xpath_node *)(begin->_node)._root;
    local_10._attr = (begin->_attribute)._attr;
  }
  else {
    if (type != type_sorted_reverse) {
      __assert_fail("false && \"Invalid node set type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2292,
                    "xpath_node pugi::impl::(anonymous namespace)::xpath_first(const xpath_node *, const xpath_node *, xpath_node_set::type_t)"
                   );
    }
    begin_local = (xpath_node *)end[-1]._node._root;
    local_10._attr = end[-1]._attribute._attr;
  }
  xVar1._attribute._attr = local_10._attr;
  xVar1._node._root = (xml_node_struct *)begin_local;
  return xVar1;
}

Assistant:

PUGI__FN xpath_node xpath_first(const xpath_node* begin, const xpath_node* end, xpath_node_set::type_t type)
	{
		if (begin == end) return xpath_node();

		switch (type)
		{
		case xpath_node_set::type_sorted:
			return *begin;

		case xpath_node_set::type_sorted_reverse:
			return *(end - 1);

		case xpath_node_set::type_unsorted:
			return *min_element(begin, end, document_order_comparator());

		default:
			assert(false && "Invalid node set type"); // unreachable
			return xpath_node();
		}
	}